

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O2

void __thiscall helics::SmallBuffer::SmallBuffer(SmallBuffer *this,SmallBuffer *sb)

{
  SmallBuffer *__src;
  
  (this->buffer)._M_elems[0x30] = 0;
  (this->buffer)._M_elems[0x31] = 0;
  (this->buffer)._M_elems[0x32] = 0;
  (this->buffer)._M_elems[0x33] = 0;
  (this->buffer)._M_elems[0x34] = 0;
  (this->buffer)._M_elems[0x35] = 0;
  (this->buffer)._M_elems[0x36] = 0;
  (this->buffer)._M_elems[0x37] = 0;
  (this->buffer)._M_elems[0x38] = 0;
  (this->buffer)._M_elems[0x39] = 0;
  (this->buffer)._M_elems[0x3a] = 0;
  (this->buffer)._M_elems[0x3b] = 0;
  (this->buffer)._M_elems[0x3c] = 0;
  (this->buffer)._M_elems[0x3d] = 0;
  (this->buffer)._M_elems[0x3e] = 0;
  (this->buffer)._M_elems[0x3f] = 0;
  (this->buffer)._M_elems[0x20] = 0;
  (this->buffer)._M_elems[0x21] = 0;
  (this->buffer)._M_elems[0x22] = 0;
  (this->buffer)._M_elems[0x23] = 0;
  (this->buffer)._M_elems[0x24] = 0;
  (this->buffer)._M_elems[0x25] = 0;
  (this->buffer)._M_elems[0x26] = 0;
  (this->buffer)._M_elems[0x27] = 0;
  (this->buffer)._M_elems[0x28] = 0;
  (this->buffer)._M_elems[0x29] = 0;
  (this->buffer)._M_elems[0x2a] = 0;
  (this->buffer)._M_elems[0x2b] = 0;
  (this->buffer)._M_elems[0x2c] = 0;
  (this->buffer)._M_elems[0x2d] = 0;
  (this->buffer)._M_elems[0x2e] = 0;
  (this->buffer)._M_elems[0x2f] = 0;
  (this->buffer)._M_elems[0x10] = 0;
  (this->buffer)._M_elems[0x11] = 0;
  (this->buffer)._M_elems[0x12] = 0;
  (this->buffer)._M_elems[0x13] = 0;
  (this->buffer)._M_elems[0x14] = 0;
  (this->buffer)._M_elems[0x15] = 0;
  (this->buffer)._M_elems[0x16] = 0;
  (this->buffer)._M_elems[0x17] = 0;
  (this->buffer)._M_elems[0x18] = 0;
  (this->buffer)._M_elems[0x19] = 0;
  (this->buffer)._M_elems[0x1a] = 0;
  (this->buffer)._M_elems[0x1b] = 0;
  (this->buffer)._M_elems[0x1c] = 0;
  (this->buffer)._M_elems[0x1d] = 0;
  (this->buffer)._M_elems[0x1e] = 0;
  (this->buffer)._M_elems[0x1f] = 0;
  (this->buffer)._M_elems[0] = 0;
  (this->buffer)._M_elems[1] = 0;
  (this->buffer)._M_elems[2] = 0;
  (this->buffer)._M_elems[3] = 0;
  (this->buffer)._M_elems[4] = 0;
  (this->buffer)._M_elems[5] = 0;
  (this->buffer)._M_elems[6] = 0;
  (this->buffer)._M_elems[7] = 0;
  (this->buffer)._M_elems[8] = 0;
  (this->buffer)._M_elems[9] = 0;
  (this->buffer)._M_elems[10] = 0;
  (this->buffer)._M_elems[0xb] = 0;
  (this->buffer)._M_elems[0xc] = 0;
  (this->buffer)._M_elems[0xd] = 0;
  (this->buffer)._M_elems[0xe] = 0;
  (this->buffer)._M_elems[0xf] = 0;
  this->bufferSize = 0;
  this->bufferCapacity = 0x40;
  this->nonOwning = false;
  this->locked = false;
  this->usingAllocatedBuffer = false;
  this->errorCondition = '\0';
  this->userKey = 0;
  __src = (SmallBuffer *)sb->heap;
  if (sb->usingAllocatedBuffer == true) {
    this->bufferCapacity = sb->bufferCapacity;
    this->usingAllocatedBuffer = true;
    this->nonOwning = sb->nonOwning;
    sb->usingAllocatedBuffer = false;
  }
  else {
    memcpy(this,__src,sb->bufferSize);
    __src = this;
  }
  this->heap = (byte *)__src;
  this->bufferSize = sb->bufferSize;
  sb->heap = (byte *)sb;
  sb->bufferCapacity = 0x40;
  sb->bufferSize = 0;
  return;
}

Assistant:

SmallBuffer(SmallBuffer&& sb) noexcept
    {
        if (sb.usingAllocatedBuffer) {
            heap = sb.heap;
            bufferCapacity = sb.bufferCapacity;
            usingAllocatedBuffer = sb.usingAllocatedBuffer;
            nonOwning = sb.nonOwning;
            sb.usingAllocatedBuffer = false;
        } else {
            std::memcpy(buffer.data(), sb.heap, sb.bufferSize);
            heap = buffer.data();
        }
        bufferSize = sb.bufferSize;
        sb.heap = sb.buffer.data();
        sb.bufferCapacity = 64;
        sb.bufferSize = 0;
    }